

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O0

shared_ptr<helics::Broker> helics::BrokerFactory::getBrokerByIndex(size_t index)

{
  size_type sVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong in_RSI;
  shared_ptr<helics::Broker> *in_RDI;
  shared_ptr<helics::Broker> sVar2;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_> brks;
  shared_ptr<helics::Broker> *this;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  *in_stack_ffffffffffffffe0;
  
  this = in_RDI;
  gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::getObjects
            ((SearchableObjectHolder<helics::Core,_helics::CoreType> *)
             brks.
             super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  sVar1 = std::
          vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
          ::size((vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                  *)&stack0xffffffffffffffd8);
  if (in_RSI < sVar1) {
    std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
    ::operator[]((vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                  *)&stack0xffffffffffffffd8,in_RSI);
    std::shared_ptr<helics::Broker>::shared_ptr(this,in_RDI);
  }
  else {
    CLI::std::shared_ptr<helics::Broker>::shared_ptr(this,in_RDI);
  }
  CLI::std::
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::
  ~vector(in_stack_ffffffffffffffe0);
  sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<helics::Broker>)
         sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Broker> getBrokerByIndex(size_t index)
{
    auto brks = searchableBrokers.getObjects();
    return brks.size() > index ? brks[index] : nullptr;
}